

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O1

Extra_BitMat_t * Extra_BitMatrixStart(int nSize)

{
  Extra_BitMat_t *pEVar1;
  uint **ppuVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  
  pEVar1 = (Extra_BitMat_t *)malloc(0x28);
  pEVar1->ppData = (uint **)0x0;
  pEVar1->nSize = 0;
  pEVar1->nWords = 0;
  pEVar1->nBitShift = 0;
  pEVar1->uMask = 0;
  pEVar1->nLookups = 0;
  pEVar1->nInserts = 0;
  *(undefined8 *)&pEVar1->nDeletes = 0;
  pEVar1->nSize = nSize;
  pEVar1->nBitShift = 5;
  pEVar1->uMask = 0x1f;
  uVar5 = (ulong)nSize;
  iVar4 = ((int)(uVar5 >> 5) + 1) - (uint)((nSize & 0x1fU) == 0);
  pEVar1->nWords = iVar4;
  ppuVar2 = (uint **)malloc(uVar5 * 8);
  pEVar1->ppData = ppuVar2;
  puVar3 = (uint *)malloc((long)(iVar4 * nSize) << 2);
  *ppuVar2 = puVar3;
  memset(puVar3,0,uVar5 * (long)iVar4 * 4);
  if (1 < nSize) {
    puVar3 = *ppuVar2;
    uVar5 = 1;
    do {
      puVar3 = puVar3 + iVar4;
      ppuVar2[uVar5] = puVar3;
      uVar5 = uVar5 + 1;
    } while ((uint)nSize != uVar5);
  }
  return pEVar1;
}

Assistant:

Extra_BitMat_t * Extra_BitMatrixStart( int nSize )
{
    Extra_BitMat_t * p;
    int i;
    p = ABC_ALLOC( Extra_BitMat_t, 1 );
    memset( p, 0, sizeof(Extra_BitMat_t) );
    p->nSize     = nSize;
    p->nBitShift = (sizeof(unsigned) == 4) ?  5:  6;
    p->uMask     = (sizeof(unsigned) == 4) ? 31: 63;
    p->nWords    = nSize / (8 * sizeof(unsigned)) + ((nSize % (8 * sizeof(unsigned))) > 0);
    p->ppData    = ABC_ALLOC( unsigned *, nSize );
    p->ppData[0] = ABC_ALLOC( unsigned, nSize * p->nWords );
    memset( p->ppData[0], 0, sizeof(unsigned) * nSize * p->nWords );
    for ( i = 1; i < nSize; i++ )
        p->ppData[i] = p->ppData[i-1] + p->nWords;
    return p;
}